

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O2

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ValidateContent
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  RESOURCE_STATE State;
  _Hash_node_base _Var1;
  __node_base *p_Var2;
  char (*in_R8) [116];
  bool bVar3;
  char (*in_stack_ffffffffffffff98) [61];
  _Hash_node_base Args_5;
  string _msg;
  Char *local_38;
  
  bVar3 = (this->m_Instances)._M_h._M_element_count != 0;
  if (!bVar3) {
    FormatString<char[18],char_const*,char[116]>
              (&_msg,(Diligent *)"TLAS with name (\'",
               (char (*) [18])
               &(this->
                super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                ).m_Desc,
               (char **)
               "\') doesn\'t have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content"
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  p_Var2 = &(this->m_Instances)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (*(int *)&p_Var2[5]._M_nxt != *(int *)&p_Var2[4]._M_nxt[0x18]._M_nxt) {
      FormatString<char[21],char_const*,char[28],char_const*,char[59]>
                (&_msg,(Diligent *)"Instance with name \'",(char (*) [21])&stack0xffffffffffffffa0,
                 (char **)"\' contains BLAS with name \'",(char (*) [28])(p_Var2[4]._M_nxt + 3),
                 (char **)"\' that was changed after TLAS build, you must rebuild TLAS",
                 (char (*) [59])in_stack_ffffffffffffff98);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
      bVar3 = false;
    }
    _Var1._M_nxt = p_Var2[4]._M_nxt;
    State = *(RESOURCE_STATE *)&_Var1._M_nxt[0xc]._M_nxt;
    if ((State & ~RESOURCE_STATE_BUILD_AS_READ) != RESOURCE_STATE_UNKNOWN) {
      Args_5._M_nxt = p_Var2[1]._M_nxt;
      local_38 = GetResourceStateFlagString(State);
      in_stack_ffffffffffffff98 = (char (*) [61])&local_38;
      FormatString<char[21],char_const*,char[28],char_const*,char[61],char_const*>
                (&_msg,(Diligent *)"Instance with name \'",(char (*) [21])&stack0xffffffffffffffa0,
                 (char **)"\' contains BLAS with name \'",(char (*) [28])(_Var1._M_nxt + 3),
                 (char **)"\' that must be in BUILD_AS_READ state, but current state is ",
                 in_stack_ffffffffffffff98,(char **)Args_5._M_nxt);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ValidateContent() const
    {
        bool result = true;

        if (this->m_Instances.empty())
        {
            LOG_ERROR_MESSAGE("TLAS with name ('", this->m_Desc.Name, "') doesn't have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content");
            result = false;
        }

        // Validate instances
        for (const auto& NameAndInst : this->m_Instances)
        {
            const InstanceDesc& Inst = NameAndInst.second;

            if (Inst.dvpVersion != Inst.pBLAS->DvpGetVersion())
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that was changed after TLAS build, you must rebuild TLAS");
                result = false;
            }

            if (Inst.pBLAS->IsInKnownState() && Inst.pBLAS->GetState() != RESOURCE_STATE_BUILD_AS_READ)
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that must be in BUILD_AS_READ state, but current state is ",
                                  GetResourceStateFlagString(Inst.pBLAS->GetState()));
                result = false;
            }
        }
        return result;
    }